

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O0

unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
 __thiscall booster::locale::localization_backend_manager::impl::get(impl *this)

{
  unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
  *this_00;
  unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
  *puVar1;
  pointer __p;
  actual_backend *in_RSI;
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  *in_RDI;
  uint i;
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  backends;
  unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
  *res;
  _Head_base<0UL,_booster::locale::localization_backend_*,_false> this_01;
  undefined4 local_2c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  *in_stack_ffffffffffffffe8;
  actual_backend *this_02;
  
  this_01._M_head_impl = (localization_backend *)in_RDI;
  this_02 = in_RSI;
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::vector((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
            *)0x23adcf);
  local_2c = 0;
  while( true ) {
    this_00 = (unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
               *)(ulong)local_2c;
    puVar1 = (unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                        *)in_RSI);
    if (puVar1 <= this_00) break;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                  *)in_RSI,(ulong)local_2c);
    std::
    vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
    ::push_back((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                 *)this_01._M_head_impl,(value_type *)in_RDI);
    local_2c = local_2c + 1;
  }
  __p = (pointer)operator_new(0x38);
  actual_backend::actual_backend(this_02,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::
  unique_ptr<booster::locale::localization_backend,std::default_delete<booster::locale::localization_backend>>
  ::unique_ptr<std::default_delete<booster::locale::localization_backend>,void>(this_00,__p);
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::~vector((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
             *)this_01._M_head_impl);
  return (__uniq_ptr_data<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>,_true,_true>
          )(tuple<booster::locale::localization_backend_*,_std::default_delete<booster::locale::localization_backend>_>
            )this_01._M_head_impl;
}

Assistant:

std::unique_ptr<localization_backend> get() const
            {
                std::vector<booster::shared_ptr<localization_backend> > backends;
                for(unsigned i=0;i<all_backends_.size();i++)
                    backends.push_back(all_backends_[i].second);
                std::unique_ptr<localization_backend> res(new actual_backend(backends,default_backends_));
                return res;
            }